

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::OurReader::decodeNumber(OurReader *this,Token *token)

{
  bool bVar1;
  _Elt_pointer ppVVar2;
  Value decoded;
  Value local_40;
  
  Value::Value(&local_40,nullValue);
  bVar1 = decodeNumber(this,token,&local_40);
  if (bVar1) {
    ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar2 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::swapPayload(ppVVar2[-1],&local_40);
    ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar2 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::setOffsetStart(ppVVar2[-1],(long)token->start_ - (long)this->begin_);
    ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar2 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::setOffsetLimit(ppVVar2[-1],(long)token->end_ - (long)this->begin_);
  }
  Value::~Value(&local_40);
  return bVar1;
}

Assistant:

bool OurReader::decodeNumber(Token& token) {
  Value decoded;
  if (!decodeNumber(token, decoded))
    return false;
  currentValue().swapPayload(decoded);
  currentValue().setOffsetStart(token.start_ - begin_);
  currentValue().setOffsetLimit(token.end_ - begin_);
  return true;
}